

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

String * __thiscall
Jinx::Impl::FoldCase_abi_cxx11_(String *__return_storage_ptr__,Impl *this,char *curr,char *end)

{
  undefined4 utf32CodePoint;
  char32_t utf32CodePoint_00;
  bool bVar1;
  size_t sVar2;
  char local_68 [8];
  char buffer2 [5];
  size_t charsOut2;
  char buffer [5];
  char32_t cp2;
  char32_t cp1;
  size_t charsOut;
  byte local_35;
  char32_t codepoint;
  uchar c;
  undefined1 local_21;
  char *local_20;
  char *end_local;
  char *curr_local;
  String *s;
  
  local_20 = curr;
  end_local = (char *)this;
  curr_local = (char *)__return_storage_ptr__;
  bVar1 = IsCaseFolded((char *)this,curr);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsCaseFolded(curr, end)",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxUnicode.cpp"
                  ,0x187,"String Jinx::Impl::FoldCase(const char *, const char *)");
  }
  local_21 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,(long)local_20 - (long)end_local);
  while (end_local < local_20) {
    local_35 = *end_local;
    if ((local_35 & 0x80) == 0x80) {
      charsOut._4_4_ = L'\0';
      _cp2 = 0;
      ConvertUtf8ToUtf32(end_local,(long)local_20 - (long)end_local,
                         (char32_t *)((long)&charsOut + 4),(size_t *)&cp2);
      stack0xffffffffffffffb4 = L'\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      bVar1 = FindCaseFoldingData(charsOut._4_4_,(char32_t *)(buffer + 4),(char32_t *)buffer);
      utf32CodePoint_00 = stack0xffffffffffffffb4;
      if (bVar1) {
        charsOut2._4_1_ = 0;
        charsOut2._0_4_ = 0;
        sVar2 = std::size<char,5ul>((char (*) [5])&charsOut2);
        ConvertUtf32ToUtf8(utf32CodePoint_00,(char *)&charsOut2,sVar2,(size_t *)&cp2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,(char *)&charsOut2);
        utf32CodePoint = buffer._0_4_;
        if (buffer._0_4_ != 0) {
          _buffer2 = 0;
          local_68[4] = '\0';
          local_68[0] = '\0';
          local_68[1] = '\0';
          local_68[2] = '\0';
          local_68[3] = '\0';
          sVar2 = std::size<char,5ul>((char (*) [5])local_68);
          ConvertUtf32ToUtf8(utf32CodePoint,local_68,sVar2,(size_t *)buffer2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                    (__return_storage_ptr__,(char *)&charsOut2);
          _cp2 = _buffer2 + _cp2;
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,end_local,_cp2);
      }
      end_local = end_local + _cp2;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                (__return_storage_ptr__,(char)UnicodeData::fastFold[local_35]);
      end_local = end_local + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String FoldCase(const char * curr, const char * end)
	{
		assert(!IsCaseFolded(curr, end));

		String s;
		s.reserve(end - curr);
		while (curr < end)
		{
			// Attempt simple (ASCII-only) folding if possible first
			unsigned char c = *curr;
			if (!((c & 0x80) == 0x80))
			{
				s.push_back(static_cast<unsigned char>(Impl::UnicodeData::fastFold[c]));
				++curr;
			}
			// Non-ASCII codepoints require lookups via the global folding map
			else
			{
				char32_t codepoint = 0;
				size_t charsOut = 0;
				Impl::ConvertUtf8ToUtf32(curr, end - curr, &codepoint, &charsOut);

				char32_t cp1 = 0;
				char32_t cp2 = 0;
				if (FindCaseFoldingData(codepoint, &cp1, &cp2))
				{
					char buffer[5] = { 0, 0, 0, 0, 0 };
					Impl::ConvertUtf32ToUtf8(cp1, buffer, std::size(buffer), &charsOut);
					s.append(buffer);
					if (cp2)
					{
						size_t charsOut2 = 0;
						char buffer2[5] = { 0, 0, 0, 0, 0 };
						Impl::ConvertUtf32ToUtf8(cp2, buffer2, std::size(buffer2), &charsOut2);
						s.append(buffer);
						charsOut += charsOut2;
					}
				}
				else
				{
					s.append(curr, charsOut);
				}
				curr += charsOut;
			}
		}

		return s;
	}